

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O2

void __thiscall QtMWidgets::Stepper::paintEvent(Stepper *this,QPaintEvent *param_1)

{
  StepperPrivate *pSVar1;
  int y1;
  QBrush *this_00;
  QBrush *this_01;
  int iVar2;
  int iVar3;
  QRect QVar4;
  QColor QVar5;
  QBrush aQStack_a8 [8];
  QPainter p;
  QPainterPath plusButton;
  QPainterPath minusButton;
  QBrush local_88 [8];
  QColor local_80;
  qreal local_70;
  double local_68;
  double local_60;
  double local_58;
  qreal local_48;
  double local_30;
  double local_28;
  
  this_00 = aQStack_a8;
  this_01 = aQStack_a8;
  QPainter::QPainter(&p,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)&p,true);
  QPainter::translate(&p,1.0,1.0);
  QVar4 = QWidget::rect(&this->super_QWidget);
  local_58 = (double)(~QVar4.x1 + QVar4.x2);
  QVar4 = QWidget::rect(&this->super_QWidget);
  local_48 = (qreal)(~QVar4.y1 + QVar4.y2);
  QPainterPath::QPainterPath(&minusButton);
  local_68 = local_58 * 0.5;
  QPainterPath::moveTo(&minusButton,local_68,local_48);
  local_70 = local_58 * 0.2;
  local_60 = local_70 * 0.5;
  QPainterPath::lineTo(&minusButton,local_60,local_48);
  local_28 = local_48 - local_70;
  QPainterPath::arcTo(&minusButton,0.0,local_28,local_70,local_70,-90.0,-90.0);
  QPainterPath::lineTo(&minusButton,0.0,local_60);
  QPainterPath::arcTo(&minusButton,0.0,0.0,local_70,local_70,-180.0,-90.0);
  QPainterPath::lineTo(&minusButton,local_68,0.0);
  QPainterPath::closeSubpath();
  QPainterPath::QPainterPath(&plusButton);
  QPainterPath::moveTo(&plusButton,local_68,0.0);
  QPainterPath::lineTo(&plusButton,local_58 - local_60,0.0);
  local_30 = local_58 - local_70;
  QPainterPath::arcTo(&plusButton,local_30,0.0,local_70,local_70,90.0,-90.0);
  QPainterPath::lineTo(&plusButton,local_58,local_48 - local_60);
  QPainterPath::arcTo(&plusButton,local_30,local_28,local_70,local_70,0.0,-90.0);
  QPainterPath::lineTo(&plusButton,local_68,local_48);
  QPainterPath::closeSubpath();
  QPainter::setPen((QColor *)&p);
  QBrush::QBrush((QBrush *)&local_80,white,SolidPattern);
  QPainter::setBrush((QBrush *)&p);
  QBrush::~QBrush((QBrush *)&local_80);
  QPainter::drawPath((QPainterPath *)&p);
  QPainter::drawPath((QPainterPath *)&p);
  pSVar1 = (this->d).d;
  if (pSVar1->minusButtonEnabled == false) {
    QVar5 = lighterColor(&pSVar1->color,0x32);
    local_80._0_8_ = QVar5._0_8_;
    local_80.ct._4_4_ = QVar5.ct._4_4_;
    local_80.ct.argb.pad = QVar5.ct._8_2_;
    QBrush::QBrush(local_88,&local_80,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,aQStack_a8,local_88,1,0x10,0x40);
    QPainter::setPen((QPen *)&p);
    QPen::~QPen((QPen *)aQStack_a8);
    this_00 = local_88;
  }
  else {
    QBrush::QBrush(aQStack_a8,&pSVar1->color,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,&local_80,aQStack_a8,1,0x10,0x40);
    QPainter::setPen((QPen *)&p);
    QPen::~QPen((QPen *)&local_80);
  }
  QBrush::~QBrush(this_00);
  iVar2 = (int)((double)((ulong)(local_48 * 0.25) & 0x8000000000000000 | 0x3fe0000000000000) +
               local_48 * 0.25);
  iVar3 = (int)((double)((ulong)(local_58 * 0.25) & 0x8000000000000000 | 0x3fe0000000000000) +
               local_58 * 0.25);
  y1 = (int)((double)((ulong)(local_48 * 0.5) & 0x8000000000000000 | 0x3fe0000000000000) +
            local_48 * 0.5);
  QPainter::drawLine(&p,iVar3 - iVar2,y1,iVar2 + iVar3,y1);
  pSVar1 = (this->d).d;
  if (pSVar1->plusButtonEnabled == false) {
    QVar5 = lighterColor(&pSVar1->color,0x32);
    local_80._0_8_ = QVar5._0_8_;
    local_80.ct._4_4_ = QVar5.ct._4_4_;
    local_80.ct.argb.pad = QVar5.ct._8_2_;
    QBrush::QBrush(local_88,&local_80,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,aQStack_a8,local_88,1,0x10,0x40);
    QPainter::setPen((QPen *)&p);
    QPen::~QPen((QPen *)aQStack_a8);
    this_01 = local_88;
  }
  else {
    QBrush::QBrush(aQStack_a8,&pSVar1->color,SolidPattern);
    QPen::QPen((QPen *)0x4000000000000000,&local_80,aQStack_a8,1,0x10,0x40);
    QPainter::setPen((QPen *)&p);
    QPen::~QPen((QPen *)&local_80);
  }
  QBrush::~QBrush(this_01);
  iVar3 = iVar3 * 3;
  QPainter::drawLine(&p,iVar3 - iVar2,y1,iVar3 + iVar2,y1);
  QPainter::drawLine(&p,iVar3,y1 - iVar2,iVar3,y1 + iVar2);
  QPainterPath::~QPainterPath(&plusButton);
  QPainterPath::~QPainterPath(&minusButton);
  QPainter::~QPainter(&p);
  return;
}

Assistant:

void
Stepper::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.translate( 1.0, 1.0 );

	const qreal width = rect().width() - 2;
	const qreal height = rect().height() - 2;
	const qreal arcSize = width * 0.2;

	QPainterPath minusButton;
	minusButton.moveTo( width / 2.0, height );
	minusButton.lineTo( arcSize / 2.0, height );
	minusButton.arcTo( 0.0, height - arcSize, arcSize, arcSize,
		-90.0, -90.0 );
	minusButton.lineTo( 0.0, arcSize / 2.0 );
	minusButton.arcTo( 0.0, 0.0, arcSize, arcSize, -180.0, -90.0 );
	minusButton.lineTo( width / 2.0, 0.0 );
	minusButton.closeSubpath();

	QPainterPath plusButton;
	plusButton.moveTo( width / 2.0, 0.0 );
	plusButton.lineTo( width - arcSize / 2.0, 0.0 );
	plusButton.arcTo( width - arcSize, 0.0, arcSize, arcSize,
		90.0, -90.0 );
	plusButton.lineTo( width, height - arcSize / 2.0 );
	plusButton.arcTo( width - arcSize, height - arcSize,
		arcSize, arcSize, 0.0, -90.0 );
	plusButton.lineTo( width / 2.0, height );
	plusButton.closeSubpath();

	p.setPen( d->color );
	p.setBrush( Qt::white );

	p.drawPath( minusButton );
	p.drawPath( plusButton );

	const int signSize = qRound( height / 4.0 );
	const int minusCenterX = qRound( width / 4.0 );
	const int centerY = qRound( height / 2.0 );
	const int plusCenterX = minusCenterX * 3;

	if( !d->minusButtonEnabled )
		p.setPen( QPen( lighterColor( d->color, 50 ), 2 ) );
	else
		p.setPen( QPen( d->color, 2 ) );

	p.drawLine( minusCenterX - signSize, centerY,
		minusCenterX + signSize, centerY );

	if( !d->plusButtonEnabled )
		p.setPen( QPen( lighterColor( d->color, 50 ), 2 ) );
	else
		p.setPen( QPen( d->color, 2 ) );

	p.drawLine( plusCenterX - signSize, centerY,
		plusCenterX + signSize, centerY );
	p.drawLine( plusCenterX, centerY - signSize,
		plusCenterX, centerY + signSize );
}